

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringUtilities.cpp
# Opt level: O2

String * __thiscall
Rml::StringUtilities::StripWhitespace_abi_cxx11_
          (String *__return_storage_ptr__,StringUtilities *this,StringView string)

{
  StringUtilities *pSVar1;
  StringUtilities *pSVar2;
  
  pSVar1 = (StringUtilities *)string.p_begin;
  while (((this < pSVar1 && ((ulong)(byte)*this < 0x21)) &&
         ((0x100002600U >> ((ulong)(byte)*this & 0x3f) & 1) != 0))) {
    this = this + 1;
  }
  do {
    pSVar2 = pSVar1;
    if (pSVar2 <= this) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      return __return_storage_ptr__;
    }
  } while (((ulong)(byte)pSVar2[-1] < 0x21) &&
          (pSVar1 = pSVar2 + -1, (0x100002600U >> ((ulong)(byte)pSVar2[-1] & 0x3f) & 1) != 0));
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,this,pSVar2);
  return __return_storage_ptr__;
}

Assistant:

RMLUICORE_API String StringUtilities::StripWhitespace(StringView string)
{
	const char* start = string.begin();
	const char* end = string.end();

	while (start < end && IsWhitespace(*start))
		start++;

	while (end > start && IsWhitespace(*(end - 1)))
		end--;

	if (start < end)
		return String(start, end);

	return String();
}